

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

float __thiscall llvm::detail::IEEEFloat::convertToFloat(IEEEFloat *this)

{
  float fVar1;
  IEEEFloat *pIVar2;
  APInt api;
  IEEEFloat *local_18;
  Significand local_10;
  
  if (this->semantics == (fltSemantics *)semIEEEsingle) {
    bitcastToAPInt((IEEEFloat *)&local_18);
    pIVar2 = (IEEEFloat *)&local_18;
    if (0x40 < (uint)local_10.part._0_4_) {
      pIVar2 = local_18;
    }
    fVar1 = *(float *)&pIVar2->semantics;
    APInt::~APInt((APInt *)&local_18);
    return fVar1;
  }
  __assert_fail("semantics == (const llvm::fltSemantics*)&semIEEEsingle && \"Float semantics are not IEEEsingle\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xbcd,"float llvm::detail::IEEEFloat::convertToFloat() const");
}

Assistant:

float IEEEFloat::convertToFloat() const {
  assert(semantics == (const llvm::fltSemantics*)&semIEEEsingle &&
         "Float semantics are not IEEEsingle");
  APInt api = bitcastToAPInt();
  return api.bitsToFloat();
}